

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O3

int aura_set_event_callback
              (aura_node *node,char *event,
              _func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *calldonecb,void *arg)

{
  aura_object *paVar1;
  int iVar2;
  
  paVar1 = aura_etable_find(node->tbl,event);
  if (paVar1 == (aura_object *)0x0) {
    iVar2 = -0x39;
  }
  else {
    iVar2 = -9;
    if (paVar1->arg_fmt == (char *)0x0) {
      paVar1->calldonecb = calldonecb;
      paVar1->arg = arg;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int aura_set_event_callback(
	struct aura_node *node,
	const char *event,
	void (*calldonecb)(struct aura_node *dev, int status, struct aura_buffer *ret, void *arg),
	void *arg)
{
	struct aura_object *o = aura_etable_find(node->tbl, event);

	if (!o)
		return -EBADSLT;

	if (!object_is_event(o))
		return -EBADF;

	o->calldonecb = calldonecb;
	o->arg = arg;
	return 0;
}